

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection_handle.cpp
# Opt level: O3

void __thiscall
libtorrent::peer_connection_handle::peer_log
          (peer_connection_handle *this,direction_t direction,char *event,char *fmt,...)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Atomic_word _Var2;
  bool bVar3;
  va_list v;
  
  this_00 = (this->m_connection).
            super___weak_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  _Var2 = this_00->_M_use_count;
  do {
    LOCK();
    iVar1 = this_00->_M_use_count;
    bVar3 = _Var2 == iVar1;
    if (bVar3) {
      this_00->_M_use_count = _Var2 + 1;
      iVar1 = _Var2;
    }
    _Var2 = iVar1;
    UNLOCK();
  } while (!bVar3);
  aux::peer_connection::peer_log
            ((this->m_connection).
             super___weak_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             direction,event,fmt);
  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  return;
}

Assistant:

void peer_connection_handle::peer_log(peer_log_alert::direction_t direction
	, char const* event, char const* fmt, ...) const
{
#ifndef TORRENT_DISABLE_LOGGING
	std::shared_ptr<aux::peer_connection> pc = native_handle();
	TORRENT_ASSERT(pc);
	va_list v;
	va_start(v, fmt);
#ifdef __clang__
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wformat-nonliteral"
#pragma clang diagnostic ignored "-Wclass-varargs"
#endif
	pc->peer_log(direction, event, fmt, v);
#ifdef __clang__
#pragma clang diagnostic pop
#endif
	va_end(v);
#else // TORRENT_DISABLE_LOGGING
	TORRENT_UNUSED(direction);
	TORRENT_UNUSED(event);
	TORRENT_UNUSED(fmt);
#endif
}